

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O2

vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
* __thiscall
psy::C::SemanticModel::
fieldsFor_CORE<std::vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>>
          (vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
           *__return_storage_ptr__,SemanticModel *this,FieldDeclarationSyntax *node,
          vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
          *decls)

{
  DeclaratorListSyntax *pDVar1;
  pointer ppFVar2;
  SymbolKind SVar3;
  int iVar4;
  iterator iVar5;
  Symbol *pSVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar7;
  DeclaratorListSyntax **ppDVar8;
  FieldDeclarationSyntax *local_40;
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  *local_38;
  
  local_40 = node;
  local_38 = __return_storage_ptr__;
  iVar5 = std::
          _Hashtable<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(((this->impl_)._M_t.
                    super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                    .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>.
                   _M_head_impl)->declsBySyntax_)._M_h,(key_type *)&local_40);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    ppDVar8 = &node->decltors_;
    while (pDVar1 = *ppDVar8, pDVar1 != (DeclaratorListSyntax *)0x0) {
      pSVar6 = &declarationBy(this,(pDVar1->
                                   super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                                   ).
                                   super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                                   .value)->super_Symbol;
      if (pSVar6 == (Symbol *)0x0) {
        if (((this->impl_)._M_t.
             super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
             .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>._M_head_impl)
            ->bindingIsOK_ == true) {
          poVar7 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x106);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::operator<<(poVar7,"<empty message>");
          std::endl<char,std::char_traits<char>>(poVar7);
        }
      }
      else {
        SVar3 = Symbol::kind(pSVar6);
        if (SVar3 != FieldDeclaration) {
          poVar7 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x109);
          poVar7 = std::operator<<(poVar7," ");
          poVar7 = std::operator<<(poVar7,"<empty message>");
          std::endl<char,std::char_traits<char>>(poVar7);
        }
        iVar4 = (*pSVar6->_vptr_Symbol[0x14])(pSVar6);
        local_40 = (FieldDeclarationSyntax *)CONCAT44(extraout_var_00,iVar4);
        std::
        vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>
        ::emplace_back<psy::C::FieldDeclarationSymbol_const*>
                  ((vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>
                    *)decls,(FieldDeclarationSymbol **)&local_40);
      }
      ppDVar8 = &(pDVar1->
                 super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                 ).
                 super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                 .next;
    }
  }
  else {
    pSVar6 = (Symbol *)
             (**(code **)(**(long **)((long)iVar5.
                                            super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
                                            ._M_cur + 0x10) + 0x30))();
    SVar3 = Symbol::kind(pSVar6);
    if (SVar3 == FieldDeclaration) {
      iVar4 = (*pSVar6->_vptr_Symbol[0x14])(pSVar6);
      local_40 = (FieldDeclarationSyntax *)CONCAT44(extraout_var,iVar4);
      std::
      vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>
      ::emplace_back<psy::C::FieldDeclarationSymbol_const*>
                ((vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>
                  *)decls,(FieldDeclarationSymbol **)&local_40);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xff);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = std::operator<<(poVar7,"<empty message>");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
  }
  ppFVar2 = (decls->
            super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (local_38->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (decls->
       super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (local_38->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = ppFVar2;
  (local_38->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (decls->
       super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (decls->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (decls->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (decls->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return local_38;
}

Assistant:

VecT SemanticModel::fieldsFor_CORE(
        const FieldDeclarationSyntax* node,
        VecT&& decls)
{
    // Anonymous structure/union fields are bound to the field declaration
    // syntax node while regular fields to the declarators syntax nodes.
    auto it = P->declsBySyntax_.find(node);
    if (it != P->declsBySyntax_.end()) {
        auto decl = it->second->asDeclaration();
        PSY_ASSERT_2(decl->kind() == SymbolKind::FieldDeclaration, return decls);
        decls.push_back(decl->asFieldDeclaration());
    }
    else {
        for (auto decltorIt = node->declarators(); decltorIt; decltorIt = decltorIt->next) {
            auto decl = declarationBy(decltorIt->value);
            if (!decl) {
                PSY_ASSERT_1(!P->bindingIsOK_);
                continue;
            }
            PSY_ASSERT_2(decl->kind() == SymbolKind::FieldDeclaration, continue);
            decls.push_back(decl->asFieldDeclaration());
        }
    }
    return std::move(decls);
}